

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::AdvancedManyDrawCalls2::Cleanup(AdvancedManyDrawCalls2 *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_acbo);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_ssbo);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_ppo);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_fsp);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteBuffers(1, &m_acbo);
		glDeleteBuffers(1, &m_ssbo);
		glDeleteVertexArrays(1, &m_vao);
		glDeleteProgramPipelines(1, &m_ppo);
		glDeleteProgram(m_vsp);
		glDeleteProgram(m_fsp);
		return NO_ERROR;
	}